

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

float diff_t(float (*floatpic) [512] [512],float *kernel,int x,int y,int n)

{
  float local_2c;
  int local_28;
  float sum;
  int i;
  int n_local;
  int y_local;
  int x_local;
  float *kernel_local;
  float (*floatpic_local) [512] [512];
  
  local_2c = 0.0;
  for (local_28 = -n; local_28 <= n; local_28 = local_28 + 1) {
    local_2c = kernel[local_28 + 2] * floatpic[local_28 + 2][x][y] + local_2c;
  }
  return local_2c;
}

Assistant:

float diff_t(
float floatpic[PIC_T][PIC_X][PIC_Y],
float kernel[5],
int x, int y, int n)
{
int i;
float sum;

sum = 0.0;
for(i=(-n);i<=n;i++)
	{
	sum += kernel[i+2]*floatpic[2+i][x][y];
	}
return(sum);
}